

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::PropertyReferenceWalk_Impl<false>
               (Var instance,RecyclableObject **propertyObject,PropertyId propertyId,Var *value,
               PropertyValueInfo *info,ScriptContext *requestContext)

{
  Type *pTVar1;
  code *pcVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *this;
  bool bVar6;
  undefined4 extraout_var;
  
  this = *propertyObject;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_00ad0360:
  do {
    if (((this->type).ptr)->typeId == TypeIds_Null) {
      bVar6 = false;
LAB_00ad043f:
      *propertyObject = this;
      return (BOOL)bVar6;
    }
    iVar3 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x16])
                      (this,instance,(ulong)(uint)propertyId,value,info,requestContext);
    bVar6 = iVar3 == 1;
    if ((iVar3 != 0) || (BVar4 = RecyclableObject::SkipsPrototype(this), BVar4 != 0))
    goto LAB_00ad043f;
    pTVar1 = (this->type).ptr;
    if ((pTVar1->flags & TypeFlagMask_HasSpecialPrototype) != TypeFlagMask_None) {
      if (pTVar1->typeId != TypeIds_Proxy) {
        iVar3 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[6])(this);
        this = (RecyclableObject *)CONCAT44(extraout_var,iVar3);
        goto LAB_00ad0360;
      }
      if ((pTVar1->prototype).ptr !=
          (((((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
            super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).nullValue.ptr)
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x57a,
                                    "(type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull())"
                                    ,
                                    "type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull()"
                                   );
        if (!bVar6) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
    }
    this = (pTVar1->prototype).ptr;
  } while( true );
}

Assistant:

BOOL JavascriptOperators::PropertyReferenceWalk_Impl(Var instance, RecyclableObject** propertyObject, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        BOOL foundProperty = false;
        RecyclableObject* object = *propertyObject;
        while (!foundProperty && !JavascriptOperators::IsNull(object))
        {
            if (unscopables && JavascriptOperators::IsPropertyUnscopable(object, propertyId))
            {
                break;
            }
            else
            {
                PropertyQueryFlags result = object->GetPropertyReferenceQuery(instance, propertyId, value, info, requestContext);
                if (result != PropertyQueryFlags::Property_NotFound)
                {
                    foundProperty = JavascriptConversion::PropertyQueryFlagsToBoolean(result);
                    break;
                }
            }

            if (object->SkipsPrototype())
            {
                break; // will return false
            }

            object = JavascriptOperators::GetPrototypeNoTrap(object);

        }
        *propertyObject = object;
        return foundProperty;
    }